

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O2

Error * ot::commissioner::tlv::GetTlvSet
                  (Error *__return_storage_ptr__,TlvSet *aTlvSet,ByteArray *aBuf,Scope aScope)

{
  char cVar1;
  element_type *peVar2;
  bool bVar3;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *this;
  char *from;
  char *to;
  ByteArray *extraout_RDX;
  ByteArray *extraout_RDX_00;
  ByteArray *extraout_RDX_01;
  ByteArray *aBytes;
  type atVar4 [2];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  allocator local_f5;
  uint local_f4;
  TlvPtr tlv;
  size_t offset;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  writer write;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_a8;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  offset = 0;
  local_d8._M_allocated_capacity = (size_type)&__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_f4 = (uint)aScope;
  local_d8._8_8_ = aTlvSet;
  do {
    if ((ulong)((long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= offset) {
      return __return_storage_ptr__;
    }
    Tlv::Deserialize((Error *)&tlv,(size_t *)__return_storage_ptr__,(ByteArray *)&offset,(Scope)aBuf
                    );
    peVar2 = tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (__return_storage_ptr__->mCode != kNone) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return __return_storage_ptr__;
    }
    if (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      abort();
    }
    bVar3 = Tlv::IsValid(tlv.
                         super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    if (bVar3) {
      local_a8.types_[0]._0_1_ = peVar2->mType;
      this = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)local_d8._8_8_,(key_type *)&local_a8)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this,&tlv.
                       super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,"coap",&local_f5);
      local_a8.types_[0] = uint_type;
      local_a8.types_[1] = string_type;
      local_a8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "dropping invalid/unknown TLV(type={}, value={})";
      local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2f;
      local_a8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_a8.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_a8.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
      local_a8.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      from = "dropping invalid/unknown TLV(type={}, value={})";
      aBytes = extraout_RDX;
      write.handler_ = &local_a8;
      local_a8.context_.types_ = local_a8.types_;
      while (from != "") {
        cVar1 = *from;
        to = from;
        while (cVar1 != '{') {
          to = to + 1;
          if (to == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write,from,"");
            aBytes = extraout_RDX_01;
            goto LAB_001b9b3e;
          }
          cVar1 = *to;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()(&write,from,to);
        from = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char,std::__cxx11::string>&>
                         (to,"",&local_a8);
        aBytes = extraout_RDX_00;
      }
LAB_001b9b3e:
      atVar4._1_7_ = 0;
      atVar4[0]._0_1_ =
           (tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           mType;
      utils::Hex_abi_cxx11_
                ((string *)&write,
                 (utils *)&(tlv.
                            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->mValue,aBytes);
      local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)write.handler_;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_a8;
      fmt.size_ = 0xd2;
      fmt.data_ = (char *)0x2f;
      local_a8.types_ = atVar4;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_50,(v10 *)"dropping invalid/unknown TLV(type={}, value={})",fmt,args);
      Log(kWarn,&local_70,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&write);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tlv.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  } while( true );
}

Assistant:

Error GetTlvSet(TlvSet &aTlvSet, const ByteArray &aBuf, Scope aScope)
{
    Error  error;
    size_t offset = 0;

    while (offset < aBuf.size())
    {
        auto tlv = tlv::Tlv::Deserialize(error, offset, aBuf, aScope);
        SuccessOrExit(error);
        VerifyOrDie(tlv != nullptr);

        if (tlv->IsValid())
        {
            aTlvSet[tlv->GetType()] = tlv;
        }
        else
        {
            // Drop invalid TLVs
            LOG_WARN(LOG_REGION_COAP, "dropping invalid/unknown TLV(type={}, value={})",
                     utils::to_underlying(tlv->GetType()), utils::Hex(tlv->GetValue()));
        }
    }

exit:
    return error;
}